

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O1

Scal __thiscall LinearExpert::queryZ(LinearExpert *this,Z *z)

{
  Z *pZVar1;
  double *pdVar2;
  double **ppdVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Scalar SVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  plainobjectbase_evaluator_data<double,_0> pVar16;
  undefined8 uVar17;
  Index index;
  ulong uVar18;
  policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
  *pol;
  ulong uVar19;
  long lVar20;
  Index othersize;
  ActualDstType actualDst_1;
  ActualDstType actualDst;
  longdouble in_ST0;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined1 auVar23 [16];
  double dVar24;
  double dVar25;
  Z dzAux;
  Z aux2;
  scalar_sum_op<double,_double> local_111;
  longdouble local_110;
  double local_100;
  double local_f8;
  undefined8 uStack_f0;
  Matrix<double,__1,__1,_0,__1,__1> local_e8;
  longdouble local_d0;
  longdouble local_c0;
  plainobjectbase_evaluator_data<double,_0> local_b0;
  detail *local_a8;
  undefined1 local_a0 [16];
  plainobjectbase_evaluator_data<double,_0> local_90;
  double *local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  undefined1 local_58 [32];
  double local_38;
  undefined8 uStack_30;
  
  pZVar1 = &this->dz;
  pdVar5 = (z->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  pdVar6 = (this->Nu).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  lVar20 = (this->Nu).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  if ((this->dz).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
      lVar20) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&pZVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar20,1);
  }
  pdVar7 = (this->dz).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  uVar19 = (this->dz).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  uVar18 = uVar19 - ((long)uVar19 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar19) {
    lVar20 = 0;
    do {
      pdVar2 = pdVar5 + lVar20;
      pdVar4 = pdVar6 + lVar20;
      dVar12 = pdVar2[1] - pdVar4[1];
      auVar23._8_4_ = SUB84(dVar12,0);
      auVar23._0_8_ = *pdVar2 - *pdVar4;
      auVar23._12_4_ = (int)((ulong)dVar12 >> 0x20);
      *(undefined1 (*) [16])(pdVar7 + lVar20) = auVar23;
      lVar20 = lVar20 + 2;
    } while (lVar20 < (long)uVar18);
  }
  if ((long)uVar18 < (long)uVar19) {
    do {
      pdVar7[uVar18] = pdVar5[uVar18] - pdVar6[uVar18];
      uVar18 = uVar18 + 1;
    } while (uVar19 != uVar18);
  }
  local_58._0_8_ = &this->Lambda;
  local_58._16_8_ = &this->Mu;
  local_58._8_8_ = pZVar1;
  Eigen::internal::
  product_evaluator<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  ::product_evaluator((product_evaluator<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                       *)(local_a0 + 8),(XprType *)local_58);
  local_80 = (((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_58._16_8_)->
             m_storage).m_data;
  lVar20 = (((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_58._16_8_)->m_storage
           ).m_rows;
  if ((this->pred_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != lVar20) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&(this->pred_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar20
               ,1);
  }
  pdVar5 = (this->pred_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  uVar19 = (this->pred_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  uVar18 = uVar19 - ((long)uVar19 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar19) {
    lVar20 = 0;
    do {
      dVar12 = ((double *)(local_a0._8_8_ + lVar20 * 8))[1] + (local_80 + lVar20)[1];
      auVar8._8_4_ = SUB84(dVar12,0);
      auVar8._0_8_ = *(double *)(local_a0._8_8_ + lVar20 * 8) + local_80[lVar20];
      auVar8._12_4_ = (int)((ulong)dVar12 >> 0x20);
      *(undefined1 (*) [16])(pdVar5 + lVar20) = auVar8;
      lVar20 = lVar20 + 2;
    } while (lVar20 < (long)uVar18);
  }
  if ((long)uVar18 < (long)uVar19) {
    do {
      pdVar5[uVar18] = *(double *)(local_a0._8_8_ + uVar18 * 8) + local_80[uVar18];
      uVar18 = uVar18 + 1;
    } while (uVar19 != uVar18);
  }
  free(local_90.data);
  local_100 = this->Sh;
  local_c0 = (longdouble)CONCAT28(local_c0._8_2_,this->wNu);
  local_f8 = this->wSigma + local_100;
  local_110 = (longdouble)CONCAT28(local_110._8_2_,(double)this->d);
  local_a0._0_8_ = &this->invSigma;
  local_a0._8_8_ = pZVar1;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_b0,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
              *)local_a0);
  uVar21 = 0;
  uVar22 = 0;
  local_58._0_8_ = pZVar1;
  local_58._8_8_ = (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_b0;
  if (local_a8 != (detail *)0x0) {
    local_a0._8_8_ =
         (pZVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    local_90.data = local_b0.data;
    SVar11 = Eigen::internal::
             redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
             ::
             run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                       ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)local_a0,(scalar_sum_op<double,_double> *)&local_e8,
                        (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                         *)local_58);
    uVar21 = SUB84(SVar11,0);
    uVar22 = (undefined4)((ulong)SVar11 >> 0x20);
  }
  pVar16.data = local_b0.data;
  local_d0 = (longdouble)CONCAT28(local_d0._8_2_,CONCAT44(uVar22,uVar21));
  this->dz_invSigma_dz = (Scal)CONCAT44(uVar22,uVar21);
  local_38 = (double)this->d;
  uStack_30 = 0;
  if ((detail *)
      (this->kappa).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != local_a8) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&(this->kappa).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               (Index)local_a8,1);
  }
  dVar24 = (local_f8 - local_110._0_8_) + 1.0;
  local_f8 = (local_f8 + local_110._0_8_ +
             *(double *)(&DAT_0018cd10 + (ulong)(-(uint)(local_c0._0_8_ == 0.0) & 1) * 8)) *
             ((local_100 + local_c0._0_8_ + 1.0) / (local_100 + local_c0._0_8_));
  dVar12 = local_d0._0_8_ / local_f8 + 1.0;
  dVar25 = ((local_38 + dVar24) / local_f8) / dVar12;
  pdVar5 = (this->kappa).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  uVar19 = (this->kappa).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  uVar18 = uVar19 - ((long)uVar19 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar19) {
    local_a8 = (detail *)0x0;
    do {
      pdVar6 = pVar16.data + (long)local_a8 * 8;
      dVar15 = pdVar6[1] * dVar25;
      auVar13._8_4_ = SUB84(dVar15,0);
      auVar13._0_8_ = *pdVar6 * dVar25;
      auVar13._12_4_ = (int)((ulong)dVar15 >> 0x20);
      *(undefined1 (*) [16])(pdVar5 + (long)local_a8) = auVar13;
      local_a8 = local_a8 + 2;
    } while ((long)local_a8 < (long)uVar18);
  }
  if ((long)uVar18 < (long)uVar19) {
    do {
      pdVar5[uVar18] = *(pVar16.data + uVar18 * 8) * dVar25;
      uVar18 = uVar18 + 1;
    } while (uVar19 != uVar18);
  }
  local_110 = (longdouble)CONCAT28(local_110._8_2_,dVar24);
  dVar12 = pow(dVar12,((double)this->d + dVar24) * -0.5);
  this->rbf_z = dVar12;
  local_100 = this->sqrtDetInvSigma;
  local_60 = local_110._0_8_ * 0.5;
  local_68 = (double)this->d * 0.5;
  boost::math::detail::
  tgamma_delta_ratio_imp<long_double,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
            ((longdouble *)local_a0,local_a8,(longdouble)local_60,(longdouble)local_68,pol);
  local_c0 = ABS(in_ST0);
  local_d0 = (longdouble)1.79769313486232e+308;
  local_110 = in_ST0;
  dVar12 = 0.0;
  if (local_d0 < local_c0) {
    boost::math::policies::detail::raise_error<std::overflow_error,double>
              ("boost::math::tgamma_delta_ratio<%1%>(%1%, %1%)","numeric overflow");
    local_70 = (double)local_110;
    dVar12 = local_70;
  }
  local_78 = (double)local_110;
  if (local_c0 <= local_d0) {
    dVar12 = local_78;
  }
  local_100 = local_100 / dVar12;
  dVar12 = pow(2.0 / local_f8,(double)this->d * 0.5);
  this->p_z_T = dVar12 * local_100 * this->rbf_z;
  uVar19 = (this->Sz).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  local_f8 = this->Sh;
  uStack_f0 = 0;
  local_e8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  local_e8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_e8,uVar19,1);
  pdVar5 = (z->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  pdVar6 = (this->Sz).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  if (local_e8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows !=
      uVar19) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_e8,uVar19,1);
  }
  uVar19 = local_e8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows - (local_e8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows >> 0x3f) & 0xfffffffffffffffe;
  if (1 < local_e8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
     ) {
    lVar20 = 0;
    do {
      pdVar7 = pdVar5 + lVar20;
      auVar9._8_4_ = SUB84(local_f8,0);
      auVar9._0_8_ = local_f8;
      auVar9._12_4_ = (int)((ulong)local_f8 >> 0x20);
      auVar23 = divpd(*(undefined1 (*) [16])(pdVar6 + lVar20),auVar9);
      dVar12 = pdVar7[1] - auVar23._8_8_;
      auVar14._8_4_ = SUB84(dVar12,0);
      auVar14._0_8_ = *pdVar7 - auVar23._0_8_;
      auVar14._12_4_ = (int)((ulong)dVar12 >> 0x20);
      *(undefined1 (*) [16])
       (&(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
          local_e8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
          )->m_storage).m_data + lVar20) = auVar14;
      lVar20 = lVar20 + 2;
    } while (lVar20 < (long)uVar19);
  }
  if ((long)uVar19 <
      local_e8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows) {
    do {
      (&(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
         local_e8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data)
        ->m_storage).m_data)[uVar19] = (double *)(pdVar5[uVar19] - pdVar6[uVar19] / local_f8);
      uVar19 = uVar19 + 1;
    } while (local_e8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows != uVar19);
  }
  local_58._0_8_ = &this->varLambda;
  local_58._8_8_ = &local_e8;
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
            ((Matrix<double,_1,1,0,_1,1> *)local_a0,
             (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
              *)local_58);
  uVar17 = local_a0._0_8_;
  pZVar1 = &this->dGamma;
  if ((double *)
      (this->dGamma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != (double *)local_a0._8_8_) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&pZVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               local_a0._8_8_,1);
  }
  pdVar5 = (this->dGamma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  uVar19 = (this->dGamma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  uVar18 = uVar19 - ((long)uVar19 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar19) {
    lVar20 = 0;
    do {
      ppdVar3 = &(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)uVar17)->m_storage)
                 .m_data + lVar20;
      dVar12 = (double)ppdVar3[1];
      pdVar6 = pdVar5 + lVar20;
      *pdVar6 = (double)*ppdVar3;
      pdVar6[1] = dVar12;
      lVar20 = lVar20 + 2;
    } while (lVar20 < (long)uVar18);
  }
  if ((long)uVar18 < (long)uVar19) {
    do {
      pdVar5[uVar18] =
           (double)(&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)uVar17)->
                     m_storage).m_data)[uVar18];
      uVar18 = uVar18 + 1;
    } while (uVar19 != uVar18);
  }
  free((void *)local_a0._0_8_);
  local_f8 = this->Sh;
  local_58._0_8_ = &local_e8;
  local_58._8_8_ = pZVar1;
  if ((this->dGamma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      == 0) {
    uVar21 = 0;
    uVar22 = 0;
  }
  else {
    local_a0._8_8_ =
         local_e8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
    local_90.data =
         (pZVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    SVar11 = Eigen::internal::
             redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
             ::
             run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                       ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)local_a0,&local_111,
                        (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                         *)local_58);
    uVar21 = SUB84(SVar11,0);
    uVar22 = (undefined4)((ulong)SVar11 >> 0x20);
  }
  this->gamma = 1.0 / local_f8 + (double)CONCAT44(uVar22,uVar21);
  pdVar5 = (this->dGamma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  uVar19 = (this->dGamma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  uVar18 = uVar19 - ((long)uVar19 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar19) {
    lVar20 = 0;
    do {
      dVar24 = pdVar5[lVar20];
      dVar12 = (pdVar5 + lVar20)[1];
      dVar12 = dVar12 + dVar12;
      auVar10._8_4_ = SUB84(dVar12,0);
      auVar10._0_8_ = dVar24 + dVar24;
      auVar10._12_4_ = (int)((ulong)dVar12 >> 0x20);
      *(undefined1 (*) [16])(pdVar5 + lVar20) = auVar10;
      lVar20 = lVar20 + 2;
    } while (lVar20 < (long)uVar18);
  }
  if ((long)uVar18 < (long)uVar19) {
    do {
      pdVar5[uVar18] = pdVar5[uVar18] + pdVar5[uVar18];
      uVar18 = uVar18 + 1;
    } while (uVar19 != uVar18);
  }
  local_f8 = this->p_z_T;
  free(local_e8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_b0.data);
  return local_f8;
}

Assistant:

EXPERT_CLASS_TEMPLATE
Scal LINEAR_EXPERT_base::queryZ( Z const &z )
{
    dz = z - Nu;
    pred_x = Lambda * dz + Mu;

    Scal dof = wSigma + Sh - d + 1.0;
    Scal aux1 = (wNu + Sh + 1.0) / (wNu + Sh) * (wSigma + Sh + d + (wNu == 0.0 ? 1.0 : 2.0));

    Z aux2 = invSigma * dz;
    dz_invSigma_dz = dz.dot( aux2 );
    Scal aux3 = 1.0 + dz_invSigma_dz / aux1;
    kappa = ( (dof+d)/aux1/aux3 ) * aux2;

    rbf_z = pow(aux3 , -0.5*(dof+d) );
    p_z_T = sqrtDetInvSigma / boost::math::tgamma_delta_ratio(0.5*dof, 0.5*d) * pow(2.0/aux1, 0.5*d) * rbf_z;

    Z dzAux = z - Sz/Sh;
    dGamma = varLambda * dzAux;
    gamma = 1.0/Sh + dzAux.dot( dGamma );
    dGamma *= 2.0;

    return p_z_T;
}